

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_grp.c
# Opt level: O1

void * GRP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  bool bVar1;
  int iVar2;
  void *opaque;
  char *pcVar3;
  void *pvVar4;
  PHYSFS_uint32 PVar5;
  PHYSFS_ErrorCode errcode;
  uint uVar6;
  PHYSFS_uint32 count;
  PHYSFS_uint8 buf [12];
  char name_1 [13];
  PHYSFS_uint32 local_54;
  PHYSFS_uint32 local_50;
  long local_49;
  int local_41;
  char local_3d [12];
  undefined1 local_31;
  
  local_54 = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_grp.c"
                  ,0x42,"void *GRP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,&local_49,0xc);
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    if (local_41 == 0x6e616d72 && local_49 == 0x65766c69536e654b) {
      *claimed = 1;
      iVar2 = __PHYSFS_readAll(io,&local_54,4);
      if (iVar2 == 0) {
        return (void *)0x0;
      }
      local_54 = PHYSFS_swapULE32(local_54);
      opaque = UNPK_openArchive(io);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (local_54 == 0) {
        return opaque;
      }
      uVar6 = local_54 * 0x10 + 0x10;
      PVar5 = local_54;
      while( true ) {
        iVar2 = __PHYSFS_readAll(io,local_3d,0xc);
        if ((iVar2 == 0) || (iVar2 = __PHYSFS_readAll(io,&local_50,4), iVar2 == 0)) {
          bVar1 = false;
        }
        else {
          local_31 = 0;
          pcVar3 = strchr(local_3d,0x20);
          if (pcVar3 != (char *)0x0) {
            *pcVar3 = '\0';
          }
          local_50 = PHYSFS_swapULE32(local_50);
          bVar1 = false;
          pvVar4 = UNPK_addEntry(opaque,local_3d,0,-1,-1,(ulong)uVar6,(ulong)local_50);
          if (pvVar4 != (void *)0x0) {
            uVar6 = uVar6 + local_50;
            bVar1 = true;
          }
        }
        if (!bVar1) break;
        PVar5 = PVar5 - 1;
        if (PVar5 == 0) {
          return opaque;
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *GRP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[12];
    PHYSFS_uint32 count = 0;
    void *unpkarc = NULL;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "KenSilverman", sizeof (buf)) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!grpLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}